

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O2

void __thiscall
iu_FileSystem_x_iutest_x_PathPrintTo_Test::Body(iu_FileSystem_x_iutest_x_PathPrintTo_Test *this)

{
  string local_250;
  path v;
  iuCodeMessage local_208;
  PrintToLogChecker ck;
  iuStreamMessage local_190;
  
  PrintToLogChecker::PrintToLogChecker(&ck,"/cxx_feature_tests.cpp");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            ((path *)&local_190,
             (char (*) [96])
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,auto_format);
  std::filesystem::absolute(&v);
  std::filesystem::__cxx11::path::~path((path *)&local_190);
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::PrintToString<std::filesystem::__cxx11::path>(&local_250,&v);
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_250);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0x10f,"Succeeded.\n");
  local_208._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_250);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  std::filesystem::__cxx11::path::~path(&v);
  PrintToLogChecker::~PrintToLogChecker(&ck);
  return;
}

Assistant:

IUTEST(FileSystem, PathPrintTo)
{
    {
        PrintToLogChecker ck("/cxx_feature_tests.cpp");
        ::std::filesystem::path v = ::std::filesystem::absolute(__FILE__);
        IUTEST_SUCCEED() << ::iutest::PrintToString(v);
    }
}